

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O0

void forth_drive(Forth *ptr)

{
  int iVar1;
  Cell CVar2;
  Cell CVar3;
  runtime_error *this;
  Cell degree;
  Cell speed;
  int num;
  Forth *ptr_local;
  
  iVar1 = ForthToInt(ptr);
  CVar2 = cppforth::Forth::forth_depth(ptr);
  if (1 < CVar2) {
    CVar2 = cppforth::Forth::forth_tocell(ptr,0);
    CVar3 = cppforth::Forth::forth_tocell(ptr,1);
    cppforth::Forth::forth_pop(ptr,2);
    c_drive((long)iVar1,(ulong)CVar3,(ulong)CVar2);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"forth_drive does not have parameters in Forth stack");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void forth_drive(cppforth::Forth* ptr){
	int num = ForthToInt(ptr);
	if (ptr->forth_depth()>=2){
		auto speed = ptr->forth_tocell(0); 
		auto degree = ptr->forth_tocell(1); ptr->forth_pop(2);
		c_drive(num, degree, speed);
	}
	else {
		throw std::runtime_error(("forth_drive does not have parameters in Forth stack"));
	}
}